

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::getRandomConstantString_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type,Random *rnd)

{
  deInt32 number;
  deUint32 number_00;
  undefined4 in_register_00000014;
  float number_01;
  allocator<char> local_21;
  Random *local_20;
  Random *rnd_local;
  string *psStack_10;
  NumberType type_local;
  
  local_20 = (Random *)CONCAT44(in_register_00000014,type);
  rnd_local._4_4_ = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (rnd_local._4_4_ == 0) {
    number = getInt(local_20);
    numberToString<int>(__return_storage_ptr__,number);
  }
  else if (rnd_local._4_4_ == 1) {
    number_00 = de::Random::getUint32(local_20);
    numberToString<unsigned_int>(__return_storage_ptr__,number_00);
  }
  else if (rnd_local._4_4_ == 2) {
    number_01 = de::Random::getFloat(local_20);
    numberToString<float>(__return_storage_ptr__,number_01);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

const string getRandomConstantString (const NumberType type, de::Random& rnd)
{
	if (type == TYPE_INT)
	{
		return numberToString<deInt32>(getInt(rnd));
	}
	else if (type == TYPE_UINT)
	{
		return numberToString<deUint32>(rnd.getUint32());
	}
	else if (type == TYPE_FLOAT)
	{
		return numberToString<float>(rnd.getFloat());
	}
	else
	{
		DE_ASSERT(false);
		return "";
	}
}